

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O3

size_type __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this,size_type first_block
          )

{
  pointer puVar1;
  unsigned_long x;
  int iVar2;
  ulong uVar3;
  long lVar4;
  size_type i;
  
  puVar1 = (this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (first_block < uVar3) {
    lVar4 = first_block * -0x40;
    do {
      x = puVar1[first_block];
      if (x != 0) {
        iVar2 = lowest_bit<unsigned_long>(x);
        return iVar2 - lVar4;
      }
      first_block = first_block + 1;
      lVar4 = lVar4 + -0x40;
    } while (uVar3 != first_block);
  }
  return 0xffffffffffffffff;
}

Assistant:

typename dynamic_bitset<Block, Allocator>::size_type
dynamic_bitset<Block, Allocator>::m_do_find_from(size_type first_block) const
{
    size_type i = first_block;

    // skip null blocks
    while (i < num_blocks() && m_bits[i] == 0)
        ++i;

    if (i >= num_blocks())
        return npos; // not found

    return i * bits_per_block + static_cast<size_type>(boost::lowest_bit(m_bits[i]));

}